

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  char *__cp;
  RTPTime RStack_10988;
  RTPTime RStack_10980;
  undefined1 auStack_10978 [8];
  RTPIPv4Address addr;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  RTPLibraryVersion RStack_10840;
  string sStack_10830;
  uint uStack_107fc;
  uint uStack_107f8;
  int num;
  int i;
  int status;
  string ipstr;
  uint32_t destip;
  uint16_t destport;
  uint16_t portbase;
  MyRTPSession sess;
  
  MyRTPSession::MyRTPSession((MyRTPSession *)&destip);
  std::__cxx11::string::string((string *)&i);
  poVar1 = std::operator<<((ostream *)&std::cout,"Using version ");
  RStack_10840 = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_(&sStack_10830,&RStack_10840);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_10830);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&sStack_10830);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(ushort *)(ipstr.field_2._M_local_buf + 0xe));
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter the destination IP address");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&i);
  __cp = (char *)std::__cxx11::string::c_str();
  ipstr.field_2._8_4_ = inet_addr(__cp);
  if (ipstr.field_2._8_4_ == 0xffffffff) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Bad IP address specified");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    sess.super_RTPSession.byepackets.
    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>.
    _M_impl._M_node._M_size._4_4_ = -1;
  }
  else {
    ipstr.field_2._8_4_ = ntohl(ipstr.field_2._8_4_);
    poVar1 = std::operator<<((ostream *)&std::cout,"Enter the destination port");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,(ushort *)(ipstr.field_2._M_local_buf + 0xc));
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Number of packets you wish to be sent:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,(int *)&uStack_107fc);
    jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
    jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)&addr.port);
    jrtplib::RTPSessionParams::SetOwnTimestampUnit((RTPSessionParams *)&addr.port,0.1);
    jrtplib::RTPSessionParams::SetAcceptOwnPackets((RTPSessionParams *)&addr.port,true);
    jrtplib::RTPUDPv4TransmissionParams::SetPortbase
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety,ipstr.field_2._14_2_);
    jrtplib::RTPUDPv4TransmissionParams::SetRTCPMultiplexing
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety,true);
    num = jrtplib::RTPSession::Create
                    ((RTPSession *)&destip,(RTPSessionParams *)&addr.port,
                     (RTPTransmissionParams *)&sessparams.m_needThreadSafety,IPv4UDPProto);
    checkerror(num);
    jrtplib::RTPIPv4Address::RTPIPv4Address
              ((RTPIPv4Address *)auStack_10978,ipstr.field_2._8_4_,ipstr.field_2._12_2_,true);
    num = jrtplib::RTPSession::AddDestination((RTPSession *)&destip,(RTPAddress *)auStack_10978);
    checkerror(num);
    for (uStack_107f8 = 1; (int)uStack_107f8 <= (int)uStack_107fc; uStack_107f8 = uStack_107f8 + 1)
    {
      printf("\nSending packet %d/%d\n",(ulong)uStack_107f8,(ulong)uStack_107fc);
      num = jrtplib::RTPSession::SendPacket((RTPSession *)&destip,"1234567890",10,'\0',false,10);
      checkerror(num);
      num = jrtplib::RTPSession::Poll((RTPSession *)&destip);
      checkerror(num);
      jrtplib::RTPTime::RTPTime(&RStack_10980,1,0);
      jrtplib::RTPTime::Wait(&RStack_10980);
    }
    jrtplib::RTPTime::RTPTime(&RStack_10988,10,0);
    jrtplib::RTPSession::BYEDestroy((RTPSession *)&destip,&RStack_10988,(void *)0x0,0);
    sess.super_RTPSession.byepackets.
    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>.
    _M_impl._M_node._M_size._4_4_ = 0;
    jrtplib::RTPIPv4Address::~RTPIPv4Address((RTPIPv4Address *)auStack_10978);
    jrtplib::RTPSessionParams::~RTPSessionParams((RTPSessionParams *)&addr.port);
    jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams
              ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  }
  std::__cxx11::string::~string((string *)&i);
  MyRTPSession::~MyRTPSession((MyRTPSession *)&destip);
  return sess.super_RTPSession.byepackets.
         super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
         ._M_impl._M_node._M_size._4_4_;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;

	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;

	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	
	// Let's also use RTCP multiplexing for this example
	transparams.SetRTCPMultiplexing(true); 

	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	// We're assuming that the destination is also using RTCP multiplexing 
	// ('true' means that the same port will be used for RTCP)
	RTPIPv4Address addr(destip,destport,true); 
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);

		// Either the background thread or the poll function itself will
		// cause the OnValidatedRTPPacket and OnRTCPSDESItem functions to
		// be called, so in this loop there's not much left to do. 
		
#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}